

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_current.cpp
# Opt level: O2

int cpptrace::detail::get_page_protections(void *page)

{
  uint uVar1;
  istream *piVar2;
  runtime_error *prVar3;
  uint uVar4;
  char x;
  char w;
  char r;
  uintptr_t stop;
  uintptr_t start;
  ifstream stream;
  uint auStack_220 [2];
  uint auStack_218 [122];
  
  std::ifstream::ifstream(&stream,"/proc/self/maps",_S_in);
  *(uint *)((long)auStack_220 + *(long *)(_stream + -0x18)) =
       *(uint *)((long)auStack_220 + *(long *)(_stream + -0x18)) & 0xffffffb5 | 8;
  while ((*(byte *)((long)auStack_218 + *(long *)(_stream + -0x18)) & 2) == 0) {
    std::istream::_M_extract<unsigned_long>((ulong *)&stream);
    std::istream::ignore((long)&stream);
    std::istream::_M_extract<unsigned_long>((ulong *)&stream);
    uVar4 = *(uint *)((long)auStack_218 + *(long *)(_stream + -0x18));
    if ((uVar4 & 2) != 0) break;
    if ((uVar4 & 5) != 0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"Failure reading /proc/self/maps");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((start <= page) && (page < stop)) {
      std::istream::ignore((long)&stream);
      piVar2 = std::operator>>((istream *)&stream,&r);
      piVar2 = std::operator>>(piVar2,&w);
      std::operator>>(piVar2,&x);
      if ((*(byte *)((long)auStack_218 + *(long *)(_stream + -0x18)) & 7) == 0) {
        uVar4 = (r == 'r') + 2;
        if (w != 'w') {
          uVar4 = (uint)(r == 'r');
        }
        uVar1 = uVar4 + 4;
        if (x != 'x') {
          uVar1 = uVar4;
        }
        std::ifstream::~ifstream(&stream);
        return uVar1;
      }
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"Failure reading /proc/self/maps");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::istream::ignore((long)&stream,-1);
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,"Failed to find mapping with page in /proc/self/maps");
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int get_page_protections(void* page) {
            auto page_addr = reinterpret_cast<uintptr_t>(page);
            std::ifstream stream("/proc/self/maps");
            stream>>std::hex;
            while(!stream.eof()) {
                uintptr_t start;
                uintptr_t stop;
                stream>>start;
                stream.ignore(1); // dash
                stream>>stop;
                if(stream.eof()) {
                    break;
                }
                if(stream.fail()) {
                    throw std::runtime_error("Failure reading /proc/self/maps");
                }
                if(page_addr >= start && page_addr < stop) {
                    stream.ignore(1); // space
                    char r, w, x; // there's a private/shared flag after these but we don't need it
                    stream>>r>>w>>x;
                    if(stream.fail() || stream.eof()) {
                        throw std::runtime_error("Failure reading /proc/self/maps");
                    }
                    int perms = 0;
                    if(r == 'r') {
                        perms |= PROT_READ;
                    }
                    if(w == 'w') {
                        perms |= PROT_WRITE;
                    }
                    if(x == 'x') {
                        perms |= PROT_EXEC;
                    }
                    // std::cerr<<"--parsed: "<<std::hex<<start<<" "<<stop<<" "<<r<<w<<x<<std::endl;
                    return perms;
                }
                stream.ignore(std::numeric_limits<std::streamsize>::max(), '\n');
            }
            throw std::runtime_error("Failed to find mapping with page in /proc/self/maps");
        }